

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Vec_Int_t * Saig_RefManRefineWithSat(Saig_RefMan_t *p,Vec_Int_t *vAigPis)

{
  Abc_Cex_t *pAVar1;
  void **ppvVar2;
  lit *begin;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  void *pvVar8;
  Vec_Int_t *vVar2PiId;
  int *piVar9;
  Vec_Int_t *p_01;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Vec_t *__ptr;
  Vec_Int_t *p_02;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  Aig_Man_t *pAVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  
  p_00 = Cnf_DeriveSimple(p->pFrames,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    return (Vec_Int_t *)0x0;
  }
  pAVar15 = p->pAig;
  iVar4 = pAVar15->nTruePis;
  iVar3 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar3 = iVar4;
  }
  if (iVar3 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)iVar3 << 2);
  }
  memset(pvVar8,0,(long)iVar4 * 4);
  iVar3 = vAigPis->nSize;
  if (0 < (long)iVar3) {
    piVar9 = vAigPis->pArray;
    lVar13 = 0;
    do {
      iVar6 = piVar9[lVar13];
      if (((long)iVar6 < 0) || (pAVar15->nObjs[2] <= iVar6)) {
        __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pAig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x2d9,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
      }
      if (iVar4 <= iVar6) goto LAB_0059724f;
      *(undefined4 *)((long)pvVar8 + (long)iVar6 * 4) = 1;
      lVar13 = lVar13 + 1;
    } while (iVar3 != lVar13);
  }
  iVar3 = p_00->nVars;
  vVar2PiId = (Vec_Int_t *)malloc(0x10);
  iVar6 = iVar3;
  if (iVar3 - 1U < 0xf) {
    iVar6 = 0x10;
  }
  vVar2PiId->nCap = iVar6;
  if (iVar6 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar6 << 2);
  }
  vVar2PiId->pArray = piVar9;
  vVar2PiId->nSize = iVar3;
  memset(piVar9,0xff,(long)iVar3 << 2);
  pAVar15 = p->pFrames;
  iVar6 = pAVar15->nObjs[2];
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar5;
  if (iVar5 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar5 << 2);
  }
  p_01->pArray = piVar10;
  pVVar11 = pAVar15->vCis;
  if (pVVar11->nSize < 1) {
    if (pvVar8 != (void *)0x0) goto LAB_00596e23;
  }
  else {
    lVar16 = 0;
    lVar13 = 0;
    do {
      uVar12 = p->vMapPiF2A->nSize;
      if (((int)uVar12 <= lVar16) || ((ulong)uVar12 <= lVar16 + 1U)) goto LAB_005971f2;
      piVar10 = p->vMapPiF2A->pArray;
      uVar12 = piVar10[lVar16];
      if (((int)uVar12 < 0) || (iVar4 <= (int)uVar12)) goto LAB_005971f2;
      if (*(int *)((long)pvVar8 + (ulong)uVar12 * 4) != 0) {
        lVar17 = *(long *)((long)pVVar11->pArray + lVar16 * 4);
        pAVar1 = p->pCex;
        uVar12 = uVar12 + pAVar1->nRegs + piVar10[lVar16 + 1] * pAVar1->nPis;
        Vec_IntPush(p_01,(uint)(((uint)(&pAVar1[1].iPo)[(int)uVar12 >> 5] >> (uVar12 & 0x1f) & 1) ==
                               0) + p_00->pVarNums[*(int *)(lVar17 + 0x24)] * 2);
        iVar6 = p_00->pVarNums[*(int *)(lVar17 + 0x24)];
        if (((long)iVar6 < 0) || (iVar3 <= iVar6)) {
LAB_0059724f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar9[iVar6] = (int)lVar13;
        pAVar15 = p->pFrames;
      }
      lVar13 = lVar13 + 1;
      pVVar11 = pAVar15->vCis;
      lVar16 = lVar16 + 2;
    } while (lVar13 < pVVar11->nSize);
LAB_00596e23:
    free(pvVar8);
  }
  uVar12 = p_01->nSize;
  iVar4 = sat_solver_solve(s,p_01->pArray,p_01->pArray + (int)uVar12,1000000,0,0,0);
  pcVar14 = "SAT";
  if (iVar4 == -1) {
    pcVar14 = "UNSAT";
  }
  printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar12,pcVar14,
         (ulong)(uint)(s->stats).conflicts);
  __ptr = Saig_RefManOrderLiterals(p,vVar2PiId,p_01);
  iVar4 = __ptr->nSize;
  lVar13 = (long)iVar4;
  if (lVar13 < 1) {
    putchar(10);
LAB_0059705b:
    putchar(10);
    p_01->nSize = 0;
LAB_0059706c:
    uVar12 = 0;
  }
  else {
    ppvVar2 = __ptr->pArray;
    lVar16 = 0;
    do {
      printf("%d ",(ulong)*(uint *)((long)ppvVar2[lVar16] + 4));
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
    putchar(10);
    if (iVar4 < 1) goto LAB_0059705b;
    ppvVar2 = __ptr->pArray;
    lVar16 = 0;
    do {
      p_01->nSize = 0;
      lVar17 = 0;
      do {
        pvVar8 = ppvVar2[lVar17];
        if (0 < *(int *)((long)pvVar8 + 4)) {
          lVar18 = 0;
          do {
            if (lVar17 != lVar16) {
              Vec_IntPush(p_01,*(int *)(*(long *)((long)pvVar8 + 8) + lVar18 * 4));
              pvVar8 = ppvVar2[lVar17];
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < *(int *)((long)pvVar8 + 4));
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar13);
      iVar6 = p_01->nSize;
      iVar5 = sat_solver_solve(s,p_01->pArray,p_01->pArray + iVar6,1000000,0,0,0);
      pcVar14 = "SAT";
      if (iVar5 == -1) {
        pcVar14 = "UNSAT";
      }
      printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(long)iVar6,pcVar14,
             (ulong)(uint)(s->stats).conflicts);
      if (iVar5 == -1) {
        *(undefined4 *)((long)__ptr->pArray[lVar16] + 4) = 0;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar13);
    if (iVar4 < 1) goto LAB_0059705b;
    ppvVar2 = __ptr->pArray;
    lVar16 = 0;
    do {
      printf("%d ",(ulong)*(uint *)((long)ppvVar2[lVar16] + 4));
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
    putchar(10);
    p_01->nSize = 0;
    if (iVar4 < 1) goto LAB_0059706c;
    ppvVar2 = __ptr->pArray;
    lVar16 = 0;
    do {
      pvVar8 = ppvVar2[lVar16];
      if (0 < *(int *)((long)pvVar8 + 4)) {
        lVar17 = 0;
        do {
          Vec_IntPush(p_01,*(int *)(*(long *)((long)pvVar8 + 8) + lVar17 * 4));
          lVar17 = lVar17 + 1;
          pvVar8 = ppvVar2[lVar16];
        } while (lVar17 < *(int *)((long)pvVar8 + 4));
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar13);
    uVar12 = p_01->nSize;
  }
  begin = p_01->pArray;
  iVar6 = sat_solver_solve(s,begin,begin + (int)uVar12,1000000,0,0,0);
  pcVar14 = "SAT";
  if (iVar6 == -1) {
    pcVar14 = "UNSAT";
  }
  printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar12,pcVar14,
         (ulong)(uint)(s->stats).conflicts);
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 100;
  p_02->nSize = 0;
  piVar10 = (int *)malloc(400);
  p_02->pArray = piVar10;
  if (0 < (int)uVar12) {
    uVar19 = 0;
    do {
      uVar7 = begin[uVar19] >> 1;
      if (((int)uVar7 < 0) || (iVar3 <= (int)uVar7)) {
LAB_005971f2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = piVar9[uVar7];
      if ((iVar6 < 0) || (p->pFrames->nObjs[2] <= iVar6)) {
        __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x347,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
      }
      Vec_IntPush(p_02,iVar6);
      uVar19 = uVar19 + 1;
    } while (uVar12 != uVar19);
  }
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  free(p_01);
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(vVar2PiId);
  if (__ptr == (Vec_Vec_t *)0x0) {
    return p_02;
  }
  ppvVar2 = __ptr->pArray;
  if (iVar4 < 1) {
    if (ppvVar2 == (void **)0x0) goto LAB_005971d8;
  }
  else {
    lVar16 = 0;
    do {
      pvVar8 = ppvVar2[lVar16];
      if (pvVar8 != (void *)0x0) {
        if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar8 + 8));
        }
        free(pvVar8);
      }
      lVar16 = lVar16 + 1;
    } while (lVar13 != lVar16);
  }
  free(ppvVar2);
LAB_005971d8:
  free(__ptr);
  return p_02;
}

Assistant:

Vec_Int_t * Saig_RefManRefineWithSat( Saig_RefMan_t * p, Vec_Int_t * vAigPis )
{
    int nConfLimit = 1000000;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits;
    Vec_Int_t * vReasons, * vAssumps, * vVisited, * vVar2PiId;
    int i, k, f, Entry, RetValue, Counter;

    // create CNF and SAT solver
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }

    // mark used AIG inputs
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAigPis, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pAig) );
        Vec_IntWriteEntry( vVisited, Entry, 1 );
    }

    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            continue;
        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }
    Vec_IntFree( vVisited );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

/*
    // AnalizeFinal does not work because it implications propagate directly
    // and SAT solver does not kick in (the number of conflicts in 0).

    // count the number of lits in the unsat core
    {
        int nCoreLits, * pCoreLits;
        nCoreLits = sat_solver_final( pSat, &pCoreLits );
        assert( nCoreLits > 0 );

        // count the number of flops
        vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
        for ( i = 0; i < nCoreLits; i++ )
        {
            int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(pCoreLits[i]) );
            int iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
            int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
            Vec_IntWriteEntry( vVisited, iInput, 1 );
        }
        // count the number of entries
        Counter = 0;
        Vec_IntForEachEntry( vVisited, Entry, i )
            Counter += Entry;
        Vec_IntFree( vVisited );

//        if ( p->fVerbose )
        printf( "AnalizeFinal: Assumptions %d (out of %d). Essential PIs = %d. Conflicts = %d.\n", 
            nCoreLits, Vec_IntSize(vAssumps), Counter, (int)pSat->stats.conflicts );
    }
*/

    // derive literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create assumptions
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

//    if ( p->fVerbose )
//        printf( "Total PIs = %d. Essential PIs = %d.\n", 
//            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );


    // transform assumptions into reasons
    vReasons = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        Vec_IntPush( vReasons, iPiNum );
    }

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    return vReasons;
}